

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

void __thiscall
cfd::core::
JsonObjectVector<cfd::js::api::json::BlindTxInRequest,_cfd::js::api::BlindTxInRequestStruct>::
DeserializeUniValue(JsonObjectVector<cfd::js::api::json::BlindTxInRequest,_cfd::js::api::BlindTxInRequestStruct>
                    *this,UniValue *value)

{
  bool bVar1;
  vector<UniValue,_std::allocator<UniValue>_> *this_00;
  undefined1 local_100 [8];
  BlindTxInRequest local_value;
  UniValue *element;
  const_iterator __end3;
  const_iterator __begin3;
  vector<UniValue,_std::allocator<UniValue>_> *__range3;
  UniValue *value_local;
  JsonObjectVector<cfd::js::api::json::BlindTxInRequest,_cfd::js::api::BlindTxInRequestStruct>
  *this_local;
  
  bVar1 = UniValue::isArray(value);
  if (bVar1) {
    std::
    vector<cfd::js::api::json::BlindTxInRequest,_std::allocator<cfd::js::api::json::BlindTxInRequest>_>
    ::clear(&(this->super_JsonVector<cfd::js::api::json::BlindTxInRequest>).
             super_vector<cfd::js::api::json::BlindTxInRequest,_std::allocator<cfd::js::api::json::BlindTxInRequest>_>
           );
    this_00 = (vector<UniValue,_std::allocator<UniValue>_> *)UniValue::getValues();
    __end3 = std::vector<UniValue,_std::allocator<UniValue>_>::begin(this_00);
    element = (UniValue *)std::vector<UniValue,_std::allocator<UniValue>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                                       *)&element), bVar1) {
      local_value.amount_ =
           (int64_t)__gnu_cxx::
                    __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                    ::operator*(&__end3);
      bVar1 = UniValue::isObject((UniValue *)local_value.amount_);
      if (bVar1) {
        js::api::json::BlindTxInRequest::BlindTxInRequest((BlindTxInRequest *)local_100);
        JsonClassBase<cfd::js::api::json::BlindTxInRequest>::DeserializeUniValue
                  ((JsonClassBase<cfd::js::api::json::BlindTxInRequest> *)local_100,
                   (UniValue *)local_value.amount_);
        std::
        vector<cfd::js::api::json::BlindTxInRequest,_std::allocator<cfd::js::api::json::BlindTxInRequest>_>
        ::push_back(&(this->super_JsonVector<cfd::js::api::json::BlindTxInRequest>).
                     super_vector<cfd::js::api::json::BlindTxInRequest,_std::allocator<cfd::js::api::json::BlindTxInRequest>_>
                    ,(value_type *)local_100);
        js::api::json::BlindTxInRequest::~BlindTxInRequest((BlindTxInRequest *)local_100);
      }
      __gnu_cxx::
      __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>::
      operator++(&__end3);
    }
  }
  return;
}

Assistant:

virtual void DeserializeUniValue(const UniValue& value) {
    if (!value.isArray()) {
      return;
    }
    std::vector<TYPE>::clear();
    for (const auto& element : value.getValues()) {
      if (element.isObject()) {
        TYPE local_value;
        local_value.DeserializeUniValue(element);
        std::vector<TYPE>::push_back(local_value);
      }
    }
  }